

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checker.cc
# Opt level: O0

bool __thiscall xLearn::Checker::check_cmd(Checker *this,HyperParam *hyper_param)

{
  size_type sVar1;
  undefined8 uVar2;
  long in_RDI;
  HyperParam *in_stack_000001a0;
  Checker *in_stack_000001a8;
  HyperParam *in_stack_000003b0;
  Checker *in_stack_000003b8;
  string local_38 [16];
  Checker *in_stack_ffffffffffffffd8;
  bool local_1;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 0x18));
  if (sVar1 == 1) {
    option_help_abi_cxx11_(in_stack_ffffffffffffffd8);
    uVar2 = std::__cxx11::string::c_str();
    printf("%s\n",uVar2);
    std::__cxx11::string::~string(local_38);
    exit(0);
  }
  if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
    local_1 = check_prediction_options(in_stack_000001a8,in_stack_000001a0);
  }
  else {
    local_1 = check_train_options(in_stack_000003b8,in_stack_000003b0);
  }
  return local_1;
}

Assistant:

bool Checker::check_cmd(HyperParam& hyper_param) {
  // Do not have any args
  if (args_.size() == 1) {
    printf("%s\n", option_help().c_str());
    exit(0);
  }
  // Parse and check argument
  if (is_train_) {
    return check_train_options(hyper_param);
  } else {
    return check_prediction_options(hyper_param);
  }
}